

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O3

void writeRgbaWithPreview2(char *fileName,int width,int height)

{
  int iVar1;
  Rgba *pRVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  undefined1 *puVar11;
  float fVar12;
  float fVar13;
  RgbaOutputFile file;
  Array<Imf_3_2::Rgba> pixels;
  Header header;
  Rgba local_a0 [3];
  long local_88;
  ulong local_80;
  Array<Imf_3_2::Rgba> local_78;
  Header local_68 [56];
  
  lVar5 = (long)width;
  uVar8 = 0xffffffffffffffff;
  if (-1 < width) {
    uVar8 = lVar5 * 8;
  }
  iVar1 = width + 7;
  if (-1 < width) {
    iVar1 = width;
  }
  pRVar2 = (Rgba *)operator_new__(uVar8);
  iVar9 = height + 7;
  if (-1 < height) {
    iVar9 = height;
  }
  local_88 = (long)(iVar1 >> 3);
  uVar6 = (iVar9 >> 3) * local_88;
  local_80 = (ulong)(uint)height;
  local_78._size = lVar5;
  local_78._data = pRVar2;
  pvVar3 = operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
  uVar8 = local_80;
  if (uVar6 != 0) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pvVar3 + lVar4) = 0xff000000;
      lVar4 = lVar4 + 4;
    } while (uVar6 * 4 - lVar4 != 0);
  }
  local_a0[0].r._h = 0;
  local_a0[0].g._h = 0;
  local_a0[0].b._h = 0;
  local_a0[0].a._h = 0;
  iVar10 = (int)local_80;
  Imf_3_2::Header::Header(local_68,width,local_80 & 0xffffffff,local_a0,0,3);
  Imf_3_2::PreviewImage::PreviewImage
            ((PreviewImage *)local_a0,iVar1 >> 3,iVar9 >> 3,(PreviewRgba *)0x0);
  Imf_3_2::Header::setPreviewImage((PreviewImage *)local_68);
  Imf_3_2::PreviewImage::~PreviewImage((PreviewImage *)local_a0);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_a0,fileName,local_68,WRITE_RGBA,iVar1);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_a0,(ulong)pRVar2,1);
  if (0 < iVar10) {
    local_88 = local_88 << 2;
    uVar6 = 0;
    do {
      drawImage7(&local_78,width,(int)uVar8,(int)uVar6);
      Imf_3_2::RgbaOutputFile::writePixels((int)local_a0);
      if ((uVar6 & 7) == 0 && 0 < width) {
        puVar11 = (undefined1 *)((long)pvVar3 + (uVar6 >> 3) * local_88 + 3);
        lVar7 = 0;
        lVar4 = _imath_half_to_float_table;
        do {
          pRVar2 = local_78._data;
          fVar13 = *(float *)(lVar4 + (ulong)local_78._data[lVar7].r._h * 4);
          if (fVar13 <= 0.0) {
            fVar13 = 0.0;
          }
          fVar12 = powf(fVar13 * 5.5555,0.4545);
          fVar12 = fVar12 * 84.66;
          fVar13 = 255.0;
          if (fVar12 <= 255.0) {
            fVar13 = fVar12;
          }
          puVar11[-3] = (char)(int)(float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13);
          fVar13 = *(float *)(_imath_half_to_float_table + (ulong)pRVar2[lVar7].g._h * 4);
          if (fVar13 <= 0.0) {
            fVar13 = 0.0;
          }
          fVar12 = powf(fVar13 * 5.5555,0.4545);
          fVar12 = fVar12 * 84.66;
          fVar13 = 255.0;
          if (fVar12 <= 255.0) {
            fVar13 = fVar12;
          }
          puVar11[-2] = (char)(int)(float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13);
          fVar13 = *(float *)(_imath_half_to_float_table + (ulong)pRVar2[lVar7].b._h * 4);
          if (fVar13 <= 0.0) {
            fVar13 = 0.0;
          }
          fVar12 = powf(fVar13 * 5.5555,0.4545);
          fVar12 = fVar12 * 84.66;
          fVar13 = 255.0;
          if (fVar12 <= 255.0) {
            fVar13 = fVar12;
          }
          puVar11[-1] = (char)(int)(float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13);
          lVar4 = _imath_half_to_float_table;
          fVar12 = *(float *)(_imath_half_to_float_table + (ulong)pRVar2[lVar7].a._h * 4) * 255.0;
          fVar13 = 255.0;
          if (fVar12 <= 255.0) {
            fVar13 = fVar12;
          }
          *puVar11 = (char)(int)(float)(-(uint)(fVar12 < 0.0) & 0x3f000000 |
                                       ~-(uint)(fVar12 < 0.0) & (uint)(fVar13 + 0.5));
          lVar7 = lVar7 + 8;
          puVar11 = puVar11 + 4;
        } while (lVar7 < lVar5);
      }
      uVar6 = uVar6 + 1;
      uVar8 = local_80;
    } while ((int)uVar6 != (int)local_80);
  }
  Imf_3_2::RgbaOutputFile::updatePreviewImage((PreviewRgba *)local_a0);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_a0);
  Imf_3_2::Header::~Header(local_68);
  operator_delete__(pvVar3);
  if (local_78._data != (Rgba *)0x0) {
    operator_delete__(local_78._data);
  }
  return;
}

Assistant:

void
writeRgbaWithPreview2 (const char fileName[], int width, int height)
{
    //
    // Write an image file with a preview image, version 2:
    //
    // - generate a file header
    // - add a dummy preview image to the file header
    // - open the file (this stores the header with the dummy
    //   preview image in the file)
    // - render the main image's pixels one scan line at a time,
    //   and store each scan line in the file before rendering
    //   the next scan line
    // - generate the preview image on the fly, while the main
    //   image is being rendered
    // - once the main image has been rendered, store the preview
    //   image in the file, overwriting the dummy preview
    //

    Array<Rgba> pixels (width);

    const int N = 8;

    int                  previewWidth  = width / N;
    int                  previewHeight = height / N;
    Array2D<PreviewRgba> previewPixels (previewHeight, previewWidth);

    Header header (width, height);
    header.setPreviewImage (PreviewImage (previewWidth, previewHeight));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, 0);

    for (int y = 0; y < height; ++y)
    {
        drawImage7 (pixels, width, height, y);
        file.writePixels (1);

        if (y % N == 0)
        {
            for (int x = 0; x < width; x += N)
            {
                const Rgba&  inPixel  = pixels[x];
                PreviewRgba& outPixel = previewPixels[y / N][x / N];

                outPixel.r = gamma (inPixel.r);
                outPixel.g = gamma (inPixel.g);
                outPixel.b = gamma (inPixel.b);
                outPixel.a = int (
                    IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) +
                    0.5f);
            }
        }
    }

    file.updatePreviewImage (&previewPixels[0][0]);
}